

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O2

Value * apply_check_equality_operation(Value *left_value,Value *right_value)

{
  ValueType VVar1;
  longlong lVar2;
  longlong lVar3;
  Value *pVVar4;
  bool val;
  longdouble lVar5;
  longdouble lVar6;
  
  VVar1 = left_value->value_type;
  if (VVar1 == ValueTypeIntegerValue) {
    if (right_value->value_type == ValueTypeIntegerValue) {
      val = *(long *)(left_value + 1) == *(long *)(right_value + 1);
      goto LAB_0010725d;
    }
    if ((right_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue) {
      lVar6 = (longdouble)*(long *)(left_value + 1);
LAB_00107228:
      lVar5 = *(longdouble *)&right_value[1].linked_variable_count;
LAB_0010722b:
      val = lVar6 == lVar5;
      goto LAB_0010725d;
    }
  }
  else if ((VVar1 & ~ValueTypeBoolValue) == ValueTypeIntegerValue) {
    if ((right_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue) {
      lVar6 = *(longdouble *)&left_value[1].linked_variable_count;
      if (right_value->value_type == ValueTypeFloatValue) goto LAB_00107228;
      lVar5 = (longdouble)*(long *)(right_value + 1);
      goto LAB_0010722b;
    }
  }
  else if ((VVar1 == ValueTypeStringValue) &&
          (val = true, right_value->value_type == ValueTypeStringValue)) goto LAB_0010725d;
  lVar2 = convert_to_integer(left_value);
  lVar3 = convert_to_integer(right_value);
  val = lVar2 == lVar3;
LAB_0010725d:
  pVVar4 = new_bool_value(val);
  return pVVar4;
}

Assistant:

Value *apply_check_equality_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_bool_value(((IntegerValue *) left_value)->integer_value == ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_bool_value(left_float == right_float);
  }
  else if (left_value->value_type == ValueTypeStringValue  && right_value->value_type == ValueTypeStringValue) {
    return new_bool_value(strcmp(((StringValue *) left_value)->string_value, ((StringValue *) left_value)->string_value) == 0);
  }

  return new_bool_value(convert_to_integer(left_value) == convert_to_integer(right_value));
}